

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_unary_op.cxx
# Opt level: O3

void __thiscall HAXX_UNARY_OP::real_unary_div::test_method(real_unary_div *this)

{
  undefined8 local_158;
  undefined8 local_150;
  undefined1 *local_148;
  undefined8 *local_140;
  undefined **local_138;
  undefined1 local_130;
  undefined8 *local_128;
  undefined1 **local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  undefined8 **local_100;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  shared_count sStack_e8;
  char *local_e0;
  char *local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x55);
  local_140 = &local_150;
  local_150 = 0xbfcbe2ff713854c7;
  local_158 = 0xbfcbe2ff713854c7;
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00150bb0;
  local_130 = 0;
  local_f8[0] = 1;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_d8 = "";
  local_110 = 0;
  local_120 = &local_148;
  local_118 = &PTR__lazy_ostream_00150bf0;
  local_138 = &PTR__lazy_ostream_00150bf0;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_100 = &local_140;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_148 = (undefined1 *)&local_158;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x56);
  local_110 = 0;
  local_130 = 0;
  local_f8[0] = 1;
  local_118 = &PTR__lazy_ostream_00150bf0;
  local_138 = &PTR__lazy_ostream_00150bf0;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 0xbfdbe2ff713854c7;
  local_158 = 0xbfdbe2ff713854c7;
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00150bb0;
  local_120 = &local_148;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_d8 = "";
  local_140 = &local_150;
  local_100 = &local_140;
  local_b8 = "";
  local_148 = (undefined1 *)&local_158;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_d0,&local_e0,0x56,1,2,2,"q.imag_i()",&local_118,"2./x",&local_138);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x57);
  local_110 = 0;
  local_130 = 0;
  local_f8[0] = 1;
  local_118 = &PTR__lazy_ostream_00150bf0;
  local_138 = &PTR__lazy_ostream_00150bf0;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 0xbfe4ea3f94ea3f95;
  local_158 = 0xbfe4ea3f94ea3f95;
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00150bb0;
  local_120 = &local_148;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_d8 = "";
  local_140 = &local_150;
  local_100 = &local_140;
  local_b8 = "";
  local_148 = (undefined1 *)&local_158;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_d0,&local_e0,0x57,1,2,2,"q.imag_j()",&local_118,"3./x",&local_138);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x58);
  local_110 = 0;
  local_130 = 0;
  local_f8[0] = 1;
  local_118 = &PTR__lazy_ostream_00150bf0;
  local_138 = &PTR__lazy_ostream_00150bf0;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 0xbfebe2ff713854c7;
  local_158 = 0xbfebe2ff713854c7;
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00150bb0;
  local_120 = &local_148;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_100 = &local_140;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_140 = &local_150;
  local_d8 = "";
  local_148 = (undefined1 *)&local_158;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_d0,&local_e0,0x58,1,2,2,"q.imag_k()",&local_118,"4./x",&local_138);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(real_unary_div)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.);
  double x = -4.59;
  q /= x;

  // Check that q is unchanged
  BOOST_CHECK_EQUAL(q.real(),  1./x);
  BOOST_CHECK_EQUAL(q.imag_i(),2./x);
  BOOST_CHECK_EQUAL(q.imag_j(),3./x);
  BOOST_CHECK_EQUAL(q.imag_k(),4./x);

}